

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  stbi_uc *psVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc sVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  char *zout;
  int iVar19;
  int iVar20;
  long lVar21;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar3 = a->zbuffer;
    pbVar4 = a->zbuffer_end;
    uVar12 = 0;
    uVar8 = 0;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar8 = (uint)*pbVar3;
    }
    pbVar3 = a->zbuffer;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar12 = (uint)*pbVar3;
    }
    if ((((pbVar4 <= a->zbuffer) || (0x8421084 < (uVar8 << 8 | uVar12) * -0x42108421)) ||
        ((uVar12 & 0x20) != 0)) || ((uVar8 & 0xf) != 8)) {
LAB_0015ed59:
      *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_0015ed6b:
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  do {
    iVar10 = 0x1a7870;
    if (a->num_bits < 1) {
      stbi__fill_bits(a);
    }
    iVar19 = a->num_bits;
    uVar8 = a->code_buffer;
    a->code_buffer = uVar8 >> 1;
    a->num_bits = iVar19 + -1;
    if (iVar19 < 3) {
      stbi__fill_bits(a);
    }
    iVar19 = a->num_bits;
    uVar12 = a->code_buffer;
    a->code_buffer = uVar12 >> 2;
    a->num_bits = iVar19 - 2U;
    switch(uVar12 & 3) {
    case 0:
      uVar12 = iVar19 - 2U & 7;
      if (uVar12 != 0) {
        if (iVar19 < 2) {
          stbi__fill_bits(a);
        }
        a->code_buffer = a->code_buffer >> (sbyte)uVar12;
        a->num_bits = a->num_bits - uVar12;
      }
      iVar10 = a->num_bits;
      if (iVar10 < 1) {
        uVar17 = 0;
      }
      else {
        uVar12 = a->code_buffer;
        uVar17 = 0;
        iVar19 = iVar10;
        do {
          *(char *)((long)local_814.fast + uVar17) = (char)uVar12;
          uVar17 = uVar17 + 1;
          uVar12 = uVar12 >> 8;
          iVar10 = iVar19 + -8;
          bVar6 = 8 < iVar19;
          iVar19 = iVar10;
        } while (bVar6);
        a->code_buffer = uVar12;
        a->num_bits = iVar10;
      }
      if (-1 < iVar10) {
        if ((uint)uVar17 < 4) {
          psVar13 = a->zbuffer;
          psVar5 = a->zbuffer_end;
          uVar17 = uVar17 & 0xffffffff;
          do {
            if (psVar13 < psVar5) {
              a->zbuffer = psVar13 + 1;
              sVar14 = *psVar13;
              psVar13 = psVar13 + 1;
            }
            else {
              sVar14 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar17) = sVar14;
            uVar17 = uVar17 + 1;
          } while (uVar17 != 4);
        }
        if (((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) &&
           (uVar17 = (ulong)local_814.fast[0], a->zbuffer + uVar17 <= a->zbuffer_end)) {
          if ((a->zout_end < a->zout + uVar17) &&
             (iVar10 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar10 == 0)) {
            return 0;
          }
          memcpy(a->zout,a->zbuffer,uVar17);
          a->zbuffer = a->zbuffer + uVar17;
          a->zout = a->zout + uVar17;
          goto LAB_0015ed48;
        }
      }
      goto LAB_0015ed59;
    case 1:
      iVar19 = stbi__zbuild_huffman
                         (&a->z_length,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar19 == 0) {
        return 0;
      }
      iVar19 = stbi__zbuild_huffman
                         (&a->z_distance,
                          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                          ,0x20);
      break;
    case 2:
      if (iVar19 < 7) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar12 = a->code_buffer;
      a->code_buffer = uVar12 >> 5;
      a->num_bits = iVar10 + -5;
      if (iVar10 < 10) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar15 = a->code_buffer;
      a->code_buffer = uVar15 >> 5;
      a->num_bits = iVar10 + -5;
      if (iVar10 < 9) {
        stbi__fill_bits(a);
      }
      uVar12 = uVar12 & 0x1f;
      iVar10 = uVar12 + 0x101;
      iVar19 = (uVar15 & 0x1f) + 1;
      uVar15 = a->code_buffer;
      a->code_buffer = uVar15 >> 4;
      a->num_bits = a->num_bits + -4;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      lVar21 = 0;
      do {
        if (a->num_bits < 3) {
          stbi__fill_bits(a);
        }
        uVar11 = a->code_buffer;
        a->code_buffer = uVar11 >> 3;
        a->num_bits = a->num_bits + -3;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar21])
             = (byte)uVar11 & 7;
        lVar21 = lVar21 + 1;
      } while ((ulong)(uVar15 & 0xf) + 4 != lVar21);
      iVar9 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar9 == 0) {
        return 0;
      }
      iVar9 = iVar19 + iVar10;
      iVar20 = 0;
      while( true ) {
        if (iVar9 <= iVar20) break;
        if (a->num_bits < 0x10) {
          uVar15 = 0xffffffff;
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_0015e689;
          }
        }
        else {
LAB_0015e689:
          uVar11 = a->code_buffer;
          uVar7 = local_814.fast[uVar11 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
            uVar15 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333) * 4;
            uVar1 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555) * 2;
            lVar21 = 0;
            do {
              lVar16 = lVar21;
              lVar21 = lVar16 + 1;
            } while (local_814.maxcode[lVar16 + 10] <= (int)uVar1);
            uVar15 = 0xffffffff;
            if (((lVar16 + 10U < 0x10) &&
                (lVar18 = (ulong)local_814.firstsymbol[lVar16 + 10] +
                          ((ulong)(uVar1 >> (7U - (char)lVar21 & 0x1f)) -
                          (ulong)local_814.firstcode[lVar16 + 10]), (int)lVar18 < 0x120)) &&
               ((ulong)*(byte *)((long)&local_814 + lVar18 + 0x484) - 9 == lVar21)) {
              a->code_buffer = uVar11 >> ((byte)(lVar16 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar21) + -9;
              uVar15 = (uint)*(ushort *)((long)&local_814 + lVar18 * 2 + 0x5a4);
            }
          }
          else {
            a->code_buffer = uVar11 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar15 = uVar7 & 0x1ff;
          }
        }
        if (uVar15 < 0x13) {
          if ((int)uVar15 < 0x10) {
            lVar21 = (long)iVar20;
            iVar20 = iVar20 + 1;
            abStack_9e9[lVar21 + 1] = (char)uVar15;
            bVar6 = true;
          }
          else {
            iVar2 = a->num_bits;
            if (uVar15 != 0x11) {
              if (uVar15 != 0x10) {
                if (iVar2 < 7) {
                  stbi__fill_bits(a);
                }
                uVar15 = a->code_buffer;
                a->code_buffer = uVar15 >> 7;
                a->num_bits = a->num_bits + -7;
                uVar15 = (uVar15 & 0x7f) + 0xb;
                goto LAB_0015e82a;
              }
              if (iVar2 < 2) {
                stbi__fill_bits(a);
              }
              uVar15 = a->code_buffer;
              a->code_buffer = uVar15 >> 2;
              a->num_bits = a->num_bits + -2;
              if (iVar20 != 0) {
                uVar15 = (uVar15 & 3) + 3;
                uVar11 = (uint)abStack_9e9[iVar20];
                goto LAB_0015e82c;
              }
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
              iVar20 = 0;
              goto LAB_0015e776;
            }
            if (iVar2 < 3) {
              stbi__fill_bits(a);
            }
            uVar15 = a->code_buffer;
            a->code_buffer = uVar15 >> 3;
            a->num_bits = a->num_bits + -3;
            uVar15 = (uVar15 & 7) + 3;
LAB_0015e82a:
            uVar11 = 0;
LAB_0015e82c:
            if (iVar9 - iVar20 < (int)uVar15) goto LAB_0015e76d;
            memset(abStack_9e9 + (long)iVar20 + 1,uVar11,(ulong)uVar15);
            iVar20 = iVar20 + uVar15;
            bVar6 = true;
          }
        }
        else {
LAB_0015e76d:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_0015e776:
          bVar6 = false;
        }
        if (!bVar6) {
          return 0;
        }
      }
      if (iVar9 != iVar20) {
        *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
        return 0;
      }
      iVar10 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar10);
      if (iVar10 == 0) {
        return 0;
      }
      iVar19 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar12,iVar19);
      iVar10 = 0;
      break;
    case 3:
      goto LAB_0015ed6b;
    }
    if (iVar19 == 0) {
      return 0;
    }
    zout = a->zout;
    do {
      if (a->num_bits < 0x10) {
        uVar12 = 0xffffffff;
        if (a->zbuffer < a->zbuffer_end) {
          stbi__fill_bits(a);
          goto LAB_0015e8ee;
        }
      }
      else {
LAB_0015e8ee:
        uVar15 = a->code_buffer;
        uVar7 = (a->z_length).fast[uVar15 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
          uVar12 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar12 = (uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4;
          uVar11 = (uVar12 >> 1 & 0x5555) + (uVar12 & 0x5555) * 2;
          lVar21 = 0;
          do {
            lVar16 = lVar21;
            lVar21 = lVar16 + 1;
          } while ((a->z_length).maxcode[lVar16 + 10] <= (int)uVar11);
          uVar12 = 0xffffffff;
          if (((lVar16 + 10U < 0x10) &&
              (lVar18 = (ulong)(a->z_length).firstsymbol[lVar16 + 10] +
                        ((ulong)(uVar11 >> (7U - (char)lVar21 & 0x1f)) -
                        (ulong)(a->z_length).firstcode[lVar16 + 10]), (int)lVar18 < 0x120)) &&
             ((ulong)*(byte *)((long)a + lVar18 + 0x4b8) - 9 == lVar21)) {
            a->code_buffer = uVar15 >> ((byte)(lVar16 + 10U) & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar21) + -9;
            uVar12 = (uint)*(ushort *)((long)a + lVar18 * 2 + 0x5d8);
          }
        }
        else {
          a->code_buffer = uVar15 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
          uVar12 = uVar7 & 0x1ff;
        }
      }
      if ((int)uVar12 < 0x100) {
        if ((int)uVar12 < 0) goto LAB_0015ebf5;
        if (a->zout_end <= zout) {
          iVar19 = stbi__zexpand(a,zout,1);
          if (iVar19 == 0) goto LAB_0015ebfe;
          zout = a->zout;
        }
        *zout = (char)uVar12;
        zout = zout + 1;
        bVar6 = true;
      }
      else if (uVar12 == 0x100) {
        a->zout = zout;
        iVar10 = 1;
        bVar6 = false;
      }
      else {
        if (0x11d < (int)uVar12) goto LAB_0015ebf5;
        uVar17 = (ulong)(uVar12 - 0x101);
        uVar12 = stbi__zlength_base[uVar17];
        if (0xffffffffffffffeb < uVar17 - 0x1c) {
          iVar19 = stbi__zlength_extra[uVar17];
          if (a->num_bits < iVar19) {
            stbi__fill_bits(a);
          }
          uVar15 = a->code_buffer;
          a->code_buffer = uVar15 >> ((byte)iVar19 & 0x1f);
          a->num_bits = a->num_bits - iVar19;
          uVar12 = uVar12 + (~(-1 << ((byte)iVar19 & 0x1f)) & uVar15);
        }
        if (a->num_bits < 0x10) {
          uVar17 = 0xffffffff;
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_0015eaab;
          }
        }
        else {
LAB_0015eaab:
          uVar15 = a->code_buffer;
          uVar7 = (a->z_distance).fast[uVar15 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
            uVar11 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4;
            uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2;
            lVar21 = 0;
            do {
              lVar16 = lVar21;
              lVar21 = lVar16 + 1;
            } while ((a->z_distance).maxcode[lVar16 + 10] <= (int)uVar11);
            uVar17 = 0xffffffff;
            if (((lVar16 + 10U < 0x10) &&
                (lVar18 = (ulong)(a->z_distance).firstsymbol[lVar16 + 10] +
                          ((ulong)(uVar11 >> (7U - (char)lVar21 & 0x1f)) -
                          (ulong)(a->z_distance).firstcode[lVar16 + 10]), (int)lVar18 < 0x120)) &&
               ((ulong)*(byte *)((long)a + lVar18 + 0xc9c) - 9 == lVar21)) {
              a->code_buffer = uVar15 >> ((byte)(lVar16 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar21) + -9;
              uVar17 = (ulong)*(ushort *)((long)a + lVar18 * 2 + 0xdbc);
            }
          }
          else {
            a->code_buffer = uVar15 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar17 = (ulong)(uVar7 & 0x1ff);
          }
        }
        if ((uint)uVar17 < 0x1e) {
          iVar19 = stbi__zdist_base[uVar17];
          if (0xffffffffffffffe5 < uVar17 - 0x1e) {
            iVar9 = stbi__zdist_extra[uVar17];
            if (a->num_bits < iVar9) {
              stbi__fill_bits(a);
            }
            uVar15 = a->code_buffer;
            a->code_buffer = uVar15 >> ((byte)iVar9 & 0x1f);
            a->num_bits = a->num_bits - iVar9;
            iVar19 = iVar19 + (~(-1 << ((byte)iVar9 & 0x1f)) & uVar15);
          }
          if ((long)iVar19 <= (long)zout - (long)a->zout_start) {
            if (a->zout_end < zout + (int)uVar12) {
              iVar9 = stbi__zexpand(a,zout,uVar12);
              if (iVar9 == 0) {
                bVar6 = false;
                iVar10 = 0;
                goto LAB_0015ec03;
              }
              zout = a->zout;
            }
            lVar21 = -(long)iVar19;
            if (iVar19 == 1) {
              bVar6 = true;
              if (uVar12 != 0) {
                memset(zout,(uint)(byte)zout[lVar21],(ulong)uVar12);
                zout = zout + (ulong)(uVar12 - 1) + 1;
              }
            }
            else {
              bVar6 = true;
              for (; uVar12 != 0; uVar12 = uVar12 - 1) {
                *zout = zout[lVar21];
                zout = zout + 1;
              }
            }
            goto LAB_0015ec03;
          }
        }
LAB_0015ebf5:
        *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_0015ebfe:
        bVar6 = false;
        iVar10 = 0;
      }
LAB_0015ec03:
    } while (bVar6);
    if (iVar10 == 0) {
      return 0;
    }
LAB_0015ed48:
    if ((uVar8 & 1) != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}